

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O1

Status __thiscall leveldb::TableBuilder::ChangeOptions(TableBuilder *this,Options *options)

{
  long lVar1;
  long *in_RDX;
  long *plVar2;
  Comparator *pCVar3;
  Slice local_28;
  Slice local_18;
  
  if ((_func_int **)*in_RDX == options->comparator->_vptr_Comparator) {
    plVar2 = in_RDX;
    pCVar3 = options->comparator;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pCVar3->_vptr_Comparator = (_func_int **)*plVar2;
      plVar2 = plVar2 + 1;
      pCVar3 = pCVar3 + 1;
    }
    pCVar3 = options->comparator + 0xc;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pCVar3->_vptr_Comparator = (_func_int **)*in_RDX;
      in_RDX = in_RDX + 1;
      pCVar3 = pCVar3 + 1;
    }
    *(undefined4 *)&options->comparator[0x14]._vptr_Comparator = 1;
    this->rep_ = (Rep *)0x0;
  }
  else {
    local_18.data_ = "changing comparator while building table";
    local_18.size_ = 0x28;
    local_28.data_ = "";
    local_28.size_ = 0;
    Status::Status((Status *)this,kInvalidArgument,&local_18,&local_28);
  }
  return (Status)(char *)this;
}

Assistant:

Status TableBuilder::ChangeOptions(const Options& options) {
  // Note: if more fields are added to Options, update
  // this function to catch changes that should not be allowed to
  // change in the middle of building a Table.
  if (options.comparator != rep_->options.comparator) {
    return Status::InvalidArgument("changing comparator while building table");
  }

  // Note that any live BlockBuilders point to rep_->options and therefore
  // will automatically pick up the updated options.
  rep_->options = options;
  rep_->index_block_options = options;
  rep_->index_block_options.block_restart_interval = 1;
  return Status::OK();
}